

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_net.cpp
# Opt level: O3

vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *
libtorrent::aux::enum_routes
          (vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
           *__return_storage_ptr__,io_context *ios,error_code *ec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *pvVar5;
  int dgram_sock;
  int local_8c;
  vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> local_88;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 local_4c [20];
  undefined8 local_38;
  
  local_88.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  iVar1 = ::socket(0x10,2,0);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    ec->val_ = iVar1;
    ec->failed_ = iVar1 != 0;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar2 = ::socket(2,2,0);
    local_8c = iVar2;
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      ec->val_ = iVar2;
      ec->failed_ = iVar2 != 0;
      ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
      (__return_storage_ptr__->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_4c._12_8_ = 0;
      local_38 = 0;
      local_4c._0_4_ = 0x1c;
      local_4c._4_2_ = 0x1a;
      local_4c._6_2_ = 0;
      local_4c._8_4_ = 0;
      local_70._M_unused._M_object = &local_8c;
      pvVar5 = &local_88;
      local_58 = ::std::
                 _Function_handler<void_(const_nlmsghdr_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/enum_net.cpp:1377:50)>
                 ::_M_invoke;
      local_60 = ::std::
                 _Function_handler<void_(const_nlmsghdr_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/enum_net.cpp:1377:50)>
                 ::_M_manager;
      local_70._8_8_ = pvVar5;
      iVar3 = anon_unknown_4::nl_dump_request
                        (iVar1,0,(nlmsghdr *)local_4c,(function<void_(const_nlmsghdr_*)> *)&local_70
                        );
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      if (iVar3 == 0) {
        (__return_storage_ptr__->
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
        _M_impl.super__Vector_impl_data._M_start =
             local_88.
             super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.
             super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        ec->val_ = iVar3;
        ec->failed_ = iVar3 != 0;
        ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
        pvVar5 = __return_storage_ptr__;
      }
      (pvVar5->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar5->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar5->
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::close(iVar2);
    }
    ::close(iVar1);
    if (local_88.
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ip_route> enum_routes(io_context& ios, error_code& ec)
	{
		std::vector<ip_route> ret;
		TORRENT_UNUSED(ios);
		ec.clear();

#ifdef TORRENT_BUILD_SIMULATOR

		TORRENT_UNUSED(ec);

		std::vector<address> ips = ios.get_ips();

		for (auto const& ip : ips)
		{
			ip_route r;
			if (ip.is_v4())
			{
				r.destination = address_v4();
				r.netmask = make_address_v4("255.0.0.0");
				address_v4::bytes_type b = ip.to_v4().to_bytes();
				b[3] = 1;
				r.gateway = address_v4(b);
			}
			else
			{
				r.destination = address_v6();
				r.netmask = make_address_v6("ffff:ffff:ffff:ffff::0");
				address_v6::bytes_type b = ip.to_v6().to_bytes();
				b[14] = 1;
				r.gateway = address_v6(b);
			}
			std::strcpy(r.name, "eth0");
			r.mtu = ios.sim().config().path_mtu(ip, ip);
			ret.push_back(r);
		}

#elif TORRENT_USE_SYSCTL
/*
		struct rt_msg
		{
			rt_msghdr m_rtm;
			char buf[512];
		};

		rt_msg m;
		int len = sizeof(rt_msg);
		bzero(&m, len);
		m.m_rtm.rtm_type = RTM_GET;
		m.m_rtm.rtm_flags = RTF_UP | RTF_GATEWAY;
		m.m_rtm.rtm_version = RTM_VERSION;
		m.m_rtm.rtm_addrs = RTA_DST | RTA_GATEWAY | RTA_NETMASK;
		m.m_rtm.rtm_seq = 0;
		m.m_rtm.rtm_msglen = len;

		int s = ::socket(PF_ROUTE, SOCK_RAW, AF_UNSPEC);
		if (s == -1)
		{
			ec = error_code(errno, system_category());
			return std::vector<ip_route>();
		}

		int n = write(s, &m, len);
		if (n == -1)
		{
			ec = error_code(errno, system_category());
			::close(s);
			return std::vector<ip_route>();
		}
		else if (n != len)
		{
			ec = boost::asio::error::operation_not_supported;
			::close(s);
			return std::vector<ip_route>();
		}
		bzero(&m, len);

		n = read(s, &m, len);
		if (n == -1)
		{
			ec = error_code(errno, system_category());
			::close(s);
			return std::vector<ip_route>();
		}

		for (rt_msghdr* ptr = &m.m_rtm; (char*)ptr < ((char*)&m.m_rtm) + n; ptr = (rt_msghdr*)(((char*)ptr) + ptr->rtm_msglen))
		{
			std::cout << " rtm_msglen: " << ptr->rtm_msglen << std::endl;
			std::cout << " rtm_type: " << ptr->rtm_type << std::endl;
			if (ptr->rtm_errno)
			{
				ec = error_code(ptr->rtm_errno, system_category());
				return std::vector<ip_route>();
			}
			if (m.m_rtm.rtm_flags & RTF_UP == 0
				|| m.m_rtm.rtm_flags & RTF_GATEWAY == 0)
			{
				ec = boost::asio::error::operation_not_supported;
				return address_v4::any();
			}
			if (ptr->rtm_addrs & RTA_DST == 0
				|| ptr->rtm_addrs & RTA_GATEWAY == 0
				|| ptr->rtm_addrs & RTA_NETMASK == 0)
			{
				ec = boost::asio::error::operation_not_supported;
				return std::vector<ip_route>();
			}
			if (ptr->rtm_msglen > len - ((char*)ptr - ((char*)&m.m_rtm)))
			{
				ec = boost::asio::error::operation_not_supported;
				return std::vector<ip_route>();
			}
			int min_len = sizeof(rt_msghdr) + 2 * sizeof(sockaddr_in);
			if (m.m_rtm.rtm_msglen < min_len)
			{
				ec = boost::asio::error::operation_not_supported;
				return std::vector<ip_route>();
			}

			ip_route r;
			// destination
			char* p = m.buf;
			sockaddr_in* sin = (sockaddr_in*)p;
			r.destination = sockaddr_to_address((sockaddr*)p);

			// gateway
			p += sin->sin_len;
			sin = (sockaddr_in*)p;
			r.gateway = sockaddr_to_address((sockaddr*)p);

			// netmask
			p += sin->sin_len;
			sin = (sockaddr_in*)p;
			r.netmask = sockaddr_to_address((sockaddr*)p);
			ret.push_back(r);
		}
		::close(s);
*/
	int mib[6] = {CTL_NET, PF_ROUTE, 0, AF_UNSPEC, NET_RT_DUMP, 0};

	std::size_t needed = 0;
#ifdef TORRENT_OS2
	if (__libsocket_sysctl(mib, 6, 0, &needed, 0, 0) < 0)
#else
	if (sysctl(mib, 6, nullptr, &needed, nullptr, 0) < 0)
#endif
	{
		ec = error_code(errno, system_category());
		return std::vector<ip_route>();
	}

	if (needed == 0)
	{
		return std::vector<ip_route>();
	}

	std::unique_ptr<char[]> buf(new (std::nothrow) char[needed]);
	if (buf == nullptr)
	{
		ec = boost::asio::error::no_memory;
		return std::vector<ip_route>();
	}

#ifdef TORRENT_OS2
	if (__libsocket_sysctl(mib, 6, buf.get(), &needed, 0, 0) < 0)
#else
	if (sysctl(mib, 6, buf.get(), &needed, nullptr, 0) < 0)
#endif
	{
		ec = error_code(errno, system_category());
		return std::vector<ip_route>();
	}

	char* end = buf.get() + needed;

	int const s = ::socket(AF_INET, SOCK_DGRAM, 0);
	if (s < 0)
	{
		ec = error_code(errno, system_category());
		return std::vector<ip_route>();
	}
	socket_closer c1(s);
	rt_msghdr* rtm;
	for (char* next = buf.get(); next < end; next += rtm->rtm_msglen)
	{
		rtm = reinterpret_cast<rt_msghdr*>(next);
		if (rtm->rtm_version != RTM_VERSION
			|| (rtm->rtm_type != RTM_ADD
			&& rtm->rtm_type != RTM_GET))
		{
			continue;
		}

		ip_route r;
		if (parse_route(s, rtm, &r)) ret.push_back(r);
	}
#elif TORRENT_USE_GETIPFORWARDTABLE
/*
	move this to enum_net_interfaces
		// Get GetAdaptersInfo() pointer
		using GetAdaptersInfo_t = DWORD (WINAPI*)(PIP_ADAPTER_INFO, PULONG);
		GetAdaptersInfo_t GetAdaptersInfo = get_library_procedure<iphlpapi, GetAdaptersInfo_t>("GetAdaptersInfo");
		if (GetAdaptersInfo == nullptr)
		{
			ec = boost::asio::error::operation_not_supported;
			return std::vector<ip_route>();
		}

		PIP_ADAPTER_INFO adapter_info = 0;
		ULONG out_buf_size = 0;
		if (GetAdaptersInfo(adapter_info, &out_buf_size) != ERROR_BUFFER_OVERFLOW)
		{
			ec = boost::asio::error::operation_not_supported;
			return std::vector<ip_route>();
		}

		adapter_info = (IP_ADAPTER_INFO*)malloc(out_buf_size);
		if (!adapter_info)
		{
			ec = boost::asio::error::no_memory;
			return std::vector<ip_route>();
		}

		if (GetAdaptersInfo(adapter_info, &out_buf_size) == NO_ERROR)
		{
			for (PIP_ADAPTER_INFO adapter = adapter_info;
				adapter != 0; adapter = adapter->Next)
			{

				ip_route r;
				r.destination = make_address(adapter->IpAddressList.IpAddress.String, ec);
				r.gateway = make_address(adapter->GatewayList.IpAddress.String, ec);
				r.netmask = make_address(adapter->IpAddressList.IpMask.String, ec);
				strncpy(r.name, adapter->AdapterName, sizeof(r.name) - 1);
				r.name[sizeof(r.name) - 1] = '\0';

				if (ec)
				{
					ec = error_code();
					continue;
				}
				ret.push_back(r);
			}
		}

		// Free memory
		free(adapter_info);
*/

		using GetIfEntry_t = DWORD (WINAPI *)(PMIB_IFROW pIfRow);
		auto GetIfEntry = aux::get_library_procedure<aux::iphlpapi, GetIfEntry_t>(
			"GetIfEntry");

		if (GetIfEntry == nullptr)
		{
			ec = boost::asio::error::operation_not_supported;
			return std::vector<ip_route>();
		}

#if _WIN32_WINNT >= 0x0600
		using GetIpForwardTable2_t = DWORD (WINAPI *)(
			ADDRESS_FAMILY, PMIB_IPFORWARD_TABLE2*);
		using FreeMibTable_t = void (WINAPI *)(PVOID Memory);

		auto GetIpForwardTable2 = aux::get_library_procedure<aux::iphlpapi, GetIpForwardTable2_t>("GetIpForwardTable2");
		auto FreeMibTable = aux::get_library_procedure<aux::iphlpapi, FreeMibTable_t>("FreeMibTable");
		if (GetIpForwardTable2 != nullptr && FreeMibTable != nullptr)
		{
			MIB_IPFORWARD_TABLE2* routes = nullptr;
			int res = GetIpForwardTable2(AF_UNSPEC, &routes);
			if (res == NO_ERROR)
			{
				for (int i = 0; i < int(routes->NumEntries); ++i)
				{
					ip_route r;
					r.gateway = sockaddr_to_address((const sockaddr*)&routes->Table[i].NextHop);
					// The scope_id in NextHop is always zero because that would make
					// things too easy apparently
					if (r.gateway.is_v6() && r.gateway.to_v6().is_link_local())
					{
						address_v6 gateway6 = r.gateway.to_v6();
						gateway6.scope_id(routes->Table[i].InterfaceIndex);
						r.gateway = gateway6;
					}
					r.destination = sockaddr_to_address(
						(const sockaddr*)&routes->Table[i].DestinationPrefix.Prefix);
					r.netmask = build_netmask(routes->Table[i].DestinationPrefix.PrefixLength
						, routes->Table[i].DestinationPrefix.Prefix.si_family);
					MIB_IFROW ifentry;
					ifentry.dwIndex = routes->Table[i].InterfaceIndex;
					if (GetIfEntry(&ifentry) == NO_ERROR)
					{
						WCHAR* name = ifentry.wszName;
						// strip UNC prefix to match the names returned by enum_net_interfaces
						const auto dev_name = L"\\DEVICE\\TCPIP_";
						const auto dev_name_len = wcslen(dev_name);
						if (wcsncmp(name, dev_name, dev_name_len) == 0)
						{
							name += dev_name_len;
						}
						wcstombs(r.name, name, sizeof(r.name) - 1);
						r.name[sizeof(r.name) - 1] = '\0';
						r.mtu = ifentry.dwMtu;
						ret.push_back(r);
					}
				}
			}
			if (routes) FreeMibTable(routes);
			return ret;
		}
#endif

		// Get GetIpForwardTable() pointer
		using GetIpForwardTable_t = DWORD (WINAPI*)(PMIB_IPFORWARDTABLE pIpForwardTable,PULONG pdwSize,BOOL bOrder);

		auto GetIpForwardTable = aux::get_library_procedure<aux::iphlpapi, GetIpForwardTable_t>("GetIpForwardTable");
		if (GetIpForwardTable == nullptr)
		{
			ec = boost::asio::error::operation_not_supported;
			return std::vector<ip_route>();
		}

		MIB_IPFORWARDTABLE* routes = nullptr;
		ULONG out_buf_size = 0;
		if (GetIpForwardTable(routes, &out_buf_size, FALSE) != ERROR_INSUFFICIENT_BUFFER)
		{
			ec = boost::asio::error::operation_not_supported;
			return std::vector<ip_route>();
		}

		routes = (MIB_IPFORWARDTABLE*)malloc(out_buf_size);
		if (!routes)
		{
			ec = boost::asio::error::no_memory;
			return std::vector<ip_route>();
		}

		if (GetIpForwardTable(routes, &out_buf_size, FALSE) == NO_ERROR)
		{
			for (int i = 0; i < int(routes->dwNumEntries); ++i)
			{
				ip_route r;
				r.destination = inaddr_to_address(&routes->table[i].dwForwardDest);
				r.netmask = inaddr_to_address(&routes->table[i].dwForwardMask);
				r.gateway = inaddr_to_address(&routes->table[i].dwForwardNextHop);
				MIB_IFROW ifentry;
				ifentry.dwIndex = routes->table[i].dwForwardIfIndex;
				if (GetIfEntry(&ifentry) == NO_ERROR)
				{
					wcstombs(r.name, ifentry.wszName, sizeof(r.name) - 1);
					r.name[sizeof(r.name) - 1] = '\0';
					r.mtu = ifentry.dwMtu;
					ret.push_back(r);
				}
			}
		}

		// Free memory
		free(routes);
#elif TORRENT_USE_NETLINK
		int const sock = ::socket(PF_ROUTE, SOCK_DGRAM, NETLINK_ROUTE);
		if (sock < 0)
		{
			ec = error_code(errno, system_category());
			return std::vector<ip_route>();
		}
		socket_closer c1(sock);

		int dgram_sock = ::socket(AF_INET, SOCK_DGRAM, 0);
		if (dgram_sock < 0)
		{
			ec = error_code(errno, system_category());
			return std::vector<ip_route>();
		}
		socket_closer c2(dgram_sock);

		struct
		{
			struct nlmsghdr hdr;
			struct rtmsg msg;
		} request{};
		request.hdr.nlmsg_len = std::uint32_t(NLMSG_LENGTH(sizeof(request.msg)));
		request.hdr.nlmsg_type = RTM_GETROUTE;
		request.msg.rtm_family = AF_UNSPEC;

		std::uint32_t seq = 0;
		if (nl_dump_request(sock, seq++, &request.hdr, [&](nlmsghdr const* msg) {
				ip_route r;
				if (parse_route(dgram_sock, msg, &r)) ret.push_back(r);
			}) != 0)
		{
			ec = error_code(errno, system_category());
			return std::vector<ip_route>();
		}
#elif TORRENT_USE_GRTTABLE

		for (int fam = 0; fam < 2; ++fam)
		{
			int const s = ::socket(fam == 0 ? AF_INET : AF_INET6, SOCK_DGRAM, 0);
			if (s < 0)
			{
				ec = error_code(errno, system_category());
				return ret;
			}
			socket_closer c1(s);
			ifconf ifc;
			ifc.ifc_len = sizeof(ifc.ifc_value);
			if (ioctl(s, SIOCGRTSIZE, &ifc, sizeof(ifc)) < 0)
			{
				ec = error_code(errno, system_category());
				return ret;
			}

			std::uint32_t const sz(ifc.ifc_value);

			std::vector<char> buf(sz);
			ifc.ifc_len = sz;
			ifc.ifc_buf = static_cast<void*>(buf.data());
			if (ioctl(s, SIOCGRTTABLE, &ifc, sizeof(ifc)) < 0)
			{
				ec = error_code(errno, system_category());
				return ret;
			}

			ifreq const* i = reinterpret_cast<ifreq const*>(ifc.ifc_buf);

			int bytes_left = static_cast<int>(ifc.ifc_len);
			while (bytes_left > 0)
			{
				route_entry const& route = i->ifr_route;

				ip_route ipr{};
				int skip = IF_NAMESIZE + sizeof(route_entry);
				if (route.destination != nullptr)
				{
					ipr.destination = sockaddr_to_address(route.destination);
					skip += route.destination->sa_len;
				}
				if (route.mask != nullptr)
				{
					ipr.netmask = sockaddr_to_address(route.mask);
					skip += route.mask->sa_len;
				}
				if (route.gateway)
				{
					ipr.gateway = sockaddr_to_address(route.gateway);
					skip += route.gateway->sa_len;
				}
				if (route.source != nullptr)
				{
					ipr.source_hint = sockaddr_to_address(route.source);
					skip += route.source->sa_len;
				}
				ipr.mtu = route.mtu;
				std::strncpy(ipr.name, i->ifr_name, sizeof(ipr.name) - 1);
				ipr.name[sizeof(ipr.name) - 1] = '\0';

				ret.push_back(ipr);
				bytes_left -= skip;
				i = reinterpret_cast<ifreq const*>(reinterpret_cast<char const*>(i) + skip);
			}
		}
#elif defined TORRENT_ANDROID && __ANDROID_API__ >= 24
		ec = boost::asio::error::operation_not_supported;
#else
#error "don't know how to enumerate network routes on this platform"
#endif
		return ret;
	}

	// returns the device name whose local address is ``addr``. If
	// no such device is found, an empty string is returned.
	std::string device_for_address(address addr, io_context& ios, error_code& ec)
	{
		std::vector<ip_interface> ifs = enum_net_interfaces(ios, ec);
		if (ec) return {};

		auto const iter = std::find_if(ifs.begin(), ifs.end()
			, [&addr](ip_interface const& iface)
			{ return iface.interface_address == addr; });
		return (iter == ifs.end()) ? std::string() : iter->name;
	}
}